

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

bool __thiscall FpgaIO::PromReadData(FpgaIO *this,uint32_t addr,uint8_t *data,uint nbytes)

{
  BasePort *pBVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  long *plVar7;
  long lVar8;
  uint uVar9;
  undefined4 in_register_0000000c;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  quadlet_t read_data;
  uint32_t nRead;
  uint local_48;
  uint32_t local_44;
  uint8_t *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,nbytes);
  if ((addr & 0xffffff) + nbytes < 0x1000000) {
    uVar13 = addr & 0xffffff | 0x3000000;
    uVar11 = 0;
    local_40 = data;
    do {
      uVar6 = (uint)local_38;
      uVar12 = uVar6 - uVar11;
      if (uVar6 < uVar11 || uVar12 == 0) {
        return uVar6 < uVar11 || uVar12 == 0;
      }
      if (0x3f < uVar12) {
        uVar12 = 0x40;
      }
      pBVar1 = (this->super_BoardIO).port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,(ulong)uVar13);
      uVar6 = 0;
      if ((char)iVar4 != '\0') {
        local_48 = 7;
        do {
          Amp1394_Sleep(1e-05);
          pBVar1 = (this->super_BoardIO).port;
          iVar4 = (*pBVar1->_vptr_BasePort[0x23])
                            (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&local_48);
          if ((char)iVar4 == '\0') goto LAB_0010a236;
          local_48 = local_48 & 7;
          uVar9 = uVar6 + 1;
        } while ((uVar6 < 7) && (uVar6 = uVar9, local_48 != 0));
        if (uVar9 == 8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"PromReadData: command failed to finish, status = ",0x31)
          ;
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8
          ;
          plVar7 = (long *)std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          lVar8 = *plVar7;
          lVar2 = *(long *)(lVar8 + -0x18);
          *(uint *)((long)plVar7 + lVar2 + 0x18) =
               *(uint *)((long)plVar7 + lVar2 + 0x18) & 0xffffffb5 | 2;
        }
        else {
          bVar3 = PromGetResult(this,&local_44,PROM_M25P16);
          if (bVar3) {
            local_44 = local_44 << 2;
            if (local_44 == 0x100) {
              uVar5 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
              uVar10 = 0xc0;
              if (3 < uVar5) {
                uVar10 = 0x2000;
              }
              pBVar1 = (this->super_BoardIO).port;
              uVar6 = (*pBVar1->_vptr_BasePort[0x26])
                                (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar10,
                                 local_40 + uVar11,(ulong)uVar12);
              if ((char)uVar6 == '\0') {
                uVar12 = 0;
              }
              uVar11 = uVar11 + uVar12;
              uVar13 = uVar13 + uVar12;
              goto LAB_0010a238;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"PromReadData: incorrect number of bytes = ",0x2a);
            plVar7 = (long *)std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            lVar8 = *plVar7;
          }
          else {
            plVar7 = &std::cout;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"PromReadData: failed to get PROM result",0x27);
            lVar8 = std::cout;
          }
        }
        std::ios::widen((char)*(undefined8 *)(lVar8 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
LAB_0010a236:
        uVar6 = 0;
      }
LAB_0010a238:
    } while ((char)uVar6 != '\0');
  }
  return false;
}

Assistant:

bool FpgaIO::PromReadData(uint32_t addr, uint8_t *data,
                         unsigned int nbytes)
{
    uint32_t addr24 = addr&0x00ffffff;
    if (addr24+nbytes > 0x00ffffff)
        return false;
    quadlet_t write_data = 0x03000000|addr24;  // 03h = Read Data Bytes
    uint32_t page = 0;
    while (page < nbytes) {
        const unsigned int maxReadSize = 64u;
        unsigned int bytesToRead = ((nbytes-page)<maxReadSize) ? (nbytes-page) : maxReadSize;
        if (!port->WriteQuadlet(BoardId, 0x08, write_data))
            return false;
        // Read FPGA status register; if 3 LSB are 0, command has finished.
        // The IEEE-1394 clock is 24.576 MHz, so it should take
        // about 256*8*(1/24.576) = 83.3 microseconds to read 256 bytes.
        // Experimentally, 1 iteration of the loop below is sufficient
        // most of the time, with 2 iterations required occasionally.
        quadlet_t read_data = 0x0007;
        int i;
        const int MAX_LOOP_CNT = 8;
        for (i = 0; (i < MAX_LOOP_CNT) && read_data; i++) {
            Amp1394_Sleep(0.00001);   // 10 usec
            if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return false;
            read_data = read_data&0x0007;
        }
        if (i == MAX_LOOP_CNT) {
            std::cout << "PromReadData: command failed to finish, status = "
                      << std::hex << read_data << std::dec << std::endl;
            return false;
        }
        // Now, read result. This should be the number of quadlets read.
        uint32_t nRead;
        if (!PromGetResult(nRead)) {
            std::cout << "PromReadData: failed to get PROM result" << std::endl;
            return false;
        }
        nRead *= 4;
        // should never happen, as for now firmware always reads 256 bytes
        // and saves to local registers in FPGA
        if (nRead != 256) {
            std::cout << "PromReadData: incorrect number of bytes = "
                      << nRead << std::endl;
            return false;
        }

        uint32_t fver = GetFirmwareVersion();
        nodeaddr_t address;
        if (fver >= 4) {address = 0x2000;}
        else {address = 0xc0;}
        if (!port->ReadBlock(BoardId, address, (quadlet_t *)(data+page), bytesToRead))
            return false;
        write_data += bytesToRead;
        page += bytesToRead;
    }
    return true;
}